

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmNtk.c
# Opt level: O1

void Sfm_CheckConsistency(Vec_Wec_t *vFanins,int nPis,int nPos,Vec_Str_t *vFixed)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  lVar3 = (long)vFanins->nSize;
  if (0 < lVar3) {
    pVVar2 = vFanins->pArray;
    lVar5 = 0;
    do {
      if (lVar5 < nPis) {
        if (pVVar2[lVar5].nSize != 0) {
LAB_004d9b26:
          __assert_fail("Vec_IntSize(vArray) == 0 && Vec_StrEntry(vFixed, i) == (char)0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/sfm/sfmNtk.c"
                        ,0x36,"void Sfm_CheckConsistency(Vec_Wec_t *, int, int, Vec_Str_t *)");
        }
        if (vFixed->nSize <= lVar5) goto LAB_004d9b07;
        if (vFixed->pArray[lVar5] != '\0') goto LAB_004d9b26;
      }
      iVar1 = pVVar2[lVar5].nSize;
      if (0 < (long)iVar1) {
        lVar4 = 0;
        do {
          if (vFanins->nSize <= pVVar2[lVar5].pArray[lVar4] + nPos) {
            __assert_fail("Fanin + nPos < Vec_WecSize(vFanins)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/sfm/sfmNtk.c"
                          ,0x3a,"void Sfm_CheckConsistency(Vec_Wec_t *, int, int, Vec_Str_t *)");
          }
          lVar4 = lVar4 + 1;
        } while (iVar1 != lVar4);
      }
      if (lVar3 - nPos <= lVar5) {
        if (iVar1 != 1) {
LAB_004d9b45:
          __assert_fail("Vec_IntSize(vArray) == 1 && Vec_StrEntry(vFixed, i) == (char)0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/sfm/sfmNtk.c"
                        ,0x3d,"void Sfm_CheckConsistency(Vec_Wec_t *, int, int, Vec_Str_t *)");
        }
        if (vFixed->nSize <= lVar5) {
LAB_004d9b07:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecStr.h"
                        ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
        }
        if (vFixed->pArray[lVar5] != '\0') goto LAB_004d9b45;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != lVar3);
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Sfm_CheckConsistency( Vec_Wec_t * vFanins, int nPis, int nPos, Vec_Str_t * vFixed )
{
    Vec_Int_t * vArray;
    int i, k, Fanin;
    // check entries
    Vec_WecForEachLevel( vFanins, vArray, i )
    {
        // PIs have no fanins
        if ( i < nPis )
            assert( Vec_IntSize(vArray) == 0 && Vec_StrEntry(vFixed, i) == (char)0 );
        // nodes are in a topo order; POs cannot be fanins
        Vec_IntForEachEntry( vArray, Fanin, k )
//            assert( Fanin < i && Fanin + nPos < Vec_WecSize(vFanins) );
            assert( Fanin + nPos < Vec_WecSize(vFanins) );
        // POs have one fanout
        if ( i + nPos >= Vec_WecSize(vFanins) )
            assert( Vec_IntSize(vArray) == 1 && Vec_StrEntry(vFixed, i) == (char)0 );
    }
}